

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O3

void utrie_enum_63(UTrie *trie,undefined1 *enumValue,undefined1 *enumRange,void *context)

{
  ulong uVar1;
  uint16_t *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  code *pcVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint32_t uVar19;
  int32_t iVar20;
  long lVar21;
  
  if ((trie == (UTrie *)0x0) ||
     (puVar2 = trie->index, enumRange == (undefined1 *)0x0 || puVar2 == (uint16_t *)0x0)) {
    return;
  }
  pcVar11 = enumSameValue;
  if (enumValue != (undefined1 *)0x0) {
    pcVar11 = (code *)enumValue;
  }
  puVar3 = trie->data32;
  iVar6 = (*pcVar11)(context);
  iVar20 = 0;
  if (puVar3 == (uint32_t *)0x0) {
    iVar20 = trie->indexLength;
  }
  iVar7 = 0;
  uVar18 = 0;
  uVar13 = 0;
  iVar10 = iVar20;
  iVar16 = iVar6;
  do {
    if (uVar13 == 0xd800) {
      iVar7 = 0x800;
    }
    else if (uVar13 == 0xdc00) {
      iVar7 = 0x6e0;
    }
    uVar12 = (ulong)puVar2[iVar7];
    uVar14 = uVar12 * 4;
    if ((int)uVar14 != iVar10) {
      if ((int)uVar14 == iVar20) {
        uVar9 = (uint)uVar18;
        if (((iVar16 != iVar6) &&
            (bVar4 = (int)uVar9 < (int)uVar13, iVar10 = iVar20, uVar9 = uVar13, bVar4)) &&
           (cVar5 = (*(code *)enumRange)(context,uVar18,uVar13,iVar16), cVar5 == '\0')) {
          return;
        }
        uVar18 = (ulong)uVar9;
        iVar16 = iVar6;
      }
      else {
        lVar21 = 0;
        do {
          if (puVar3 == (uint32_t *)0x0) {
            uVar9 = (uint)puVar2[uVar12 * 4 + lVar21];
          }
          else {
            uVar9 = puVar3[uVar12 * 4 + lVar21];
          }
          iVar10 = (*pcVar11)(context,uVar9);
          if (iVar10 != iVar16) {
            uVar15 = (ulong)uVar13 + lVar21;
            if (((int)uVar18 < (int)uVar15) &&
               (cVar5 = (*(code *)enumRange)(context,uVar18,uVar15 & 0xffffffff,iVar16),
               cVar5 == '\0')) {
              return;
            }
            uVar14 = (ulong)((uint)uVar14 | -(uint)(lVar21 != 0));
            uVar18 = uVar15 & 0xffffffff;
            iVar16 = iVar10;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0x20);
        iVar10 = (int)uVar14;
      }
    }
    uVar13 = uVar13 + 0x20;
    iVar7 = iVar7 + 1;
  } while ((int)uVar13 < 0x10000);
  uVar9 = 0xd800;
  do {
    uVar17 = (uint)uVar18;
    if ((uint)puVar2[(int)uVar9 >> 5] * 4 == iVar20) {
      if (((iVar16 != iVar6) &&
          (bVar4 = (int)uVar17 < (int)uVar13, iVar10 = iVar20, uVar17 = uVar13, bVar4)) &&
         (cVar5 = (*(code *)enumRange)(context,uVar18,uVar13,iVar16), cVar5 == '\0')) {
        return;
      }
      uVar9 = uVar9 + 0x20;
      uVar13 = uVar13 + 0x8000;
      uVar18 = (ulong)uVar17;
      iVar16 = iVar6;
    }
    else {
      uVar8 = (uint)puVar2[(int)uVar9 >> 5] * 4 + (uVar9 & 0x1f);
      if (puVar3 == (uint32_t *)0x0) {
        uVar19 = (uint32_t)puVar2[uVar8];
      }
      else {
        uVar19 = puVar3[uVar8];
      }
      uVar8 = (*trie->getFoldingOffset)(uVar19);
      if ((int)uVar8 < 1) {
        if (((iVar16 != iVar6) &&
            (bVar4 = (int)uVar17 < (int)uVar13, iVar10 = iVar20, uVar17 = uVar13, bVar4)) &&
           (cVar5 = (*(code *)enumRange)(context,uVar18,uVar13,iVar16), cVar5 == '\0')) {
          return;
        }
        uVar13 = uVar13 + 0x400;
        uVar18 = (ulong)uVar17;
        iVar16 = iVar6;
      }
      else {
        uVar12 = (ulong)uVar8;
        do {
          uVar14 = (ulong)puVar2[uVar12];
          uVar15 = uVar14 * 4;
          if ((int)uVar15 != iVar10) {
            if ((int)uVar15 == iVar20) {
              uVar17 = (uint)uVar18;
              if (((iVar16 != iVar6) &&
                  (bVar4 = (int)uVar17 < (int)uVar13, iVar10 = iVar20, uVar17 = uVar13, bVar4)) &&
                 (cVar5 = (*(code *)enumRange)(context,uVar18,uVar13,iVar16), cVar5 == '\0')) {
                return;
              }
              uVar18 = (ulong)uVar17;
              iVar16 = iVar6;
            }
            else {
              lVar21 = 0;
              do {
                if (puVar3 == (uint32_t *)0x0) {
                  uVar17 = (uint)puVar2[uVar14 * 4 + lVar21];
                }
                else {
                  uVar17 = puVar3[uVar14 * 4 + lVar21];
                }
                iVar10 = (*pcVar11)(context,uVar17);
                if (iVar10 != iVar16) {
                  uVar1 = (ulong)uVar13 + lVar21;
                  if (((int)uVar18 < (int)uVar1) &&
                     (cVar5 = (*(code *)enumRange)(context,uVar18,uVar1 & 0xffffffff,iVar16),
                     cVar5 == '\0')) {
                    return;
                  }
                  uVar15 = (ulong)((uint)uVar15 | -(uint)(lVar21 != 0));
                  uVar18 = uVar1 & 0xffffffff;
                  iVar16 = iVar10;
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 != 0x20);
              iVar10 = (int)uVar15;
            }
          }
          uVar13 = uVar13 + 0x20;
          iVar7 = (int)uVar12;
          uVar12 = uVar12 + 1;
        } while (iVar7 < (int)(uVar8 + 0x1f));
      }
      uVar9 = uVar9 + 1;
    }
    if (0xdbff < (int)uVar9) {
      (*(code *)enumRange)(context,uVar18,uVar13,iVar16);
      return;
    }
  } while( true );
}

Assistant:

U_CAPI void U_EXPORT2
utrie_enum(const UTrie *trie,
           UTrieEnumValue *enumValue, UTrieEnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev;
    int32_t l, i, j, block, prevBlock, nullBlock, offset;

    /* check arguments */
    if(trie==NULL || trie->index==NULL || enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    idx=trie->index;
    data32=trie->data32;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    if(data32==NULL) {
        nullBlock=trie->indexLength;
    } else {
        nullBlock=0;
    }

    /* set variables for previous range */
    prevBlock=nullBlock;
    prev=0;
    prevValue=initialValue;

    /* enumerate BMP - the main loop enumerates data blocks */
    for(i=0, c=0; c<=0xffff; ++i) {
        if(c==0xd800) {
            /* skip lead surrogate code _units_, go to lead surr. code _points_ */
            i=UTRIE_BMP_INDEX_LENGTH;
        } else if(c==0xdc00) {
            /* go back to regular BMP code points */
            i=c>>UTRIE_SHIFT;
        }

        block=idx[i]<<UTRIE_INDEX_SHIFT;
        if(block==prevBlock) {
            /* the block is the same as the previous one, and filled with value */
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(block==nullBlock) {
            /* this is the all-initial-value block */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE_DATA_BLOCK_LENGTH;
        } else {
            prevBlock=block;
            for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                if(value!=prevValue) {
                    if(prev<c) {
                        if(!enumRange(context, prev, c, prevValue)) {
                            return;
                        }
                    }
                    if(j>0) {
                        /* the block is not filled with all the same value */
                        prevBlock=-1;
                    }
                    prev=c;
                    prevValue=value;
                }
                ++c;
            }
        }
    }

    /* enumerate supplementary code points */
    for(l=0xd800; l<0xdc00;) {
        /* lead surrogate access */
        offset=idx[l>>UTRIE_SHIFT]<<UTRIE_INDEX_SHIFT;
        if(offset==nullBlock) {
            /* no entries for a whole block of lead surrogates */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            l+=UTRIE_DATA_BLOCK_LENGTH;
            c+=UTRIE_DATA_BLOCK_LENGTH<<10;
            continue;
        }

        value= data32!=NULL ? data32[offset+(l&UTRIE_MASK)] : idx[offset+(l&UTRIE_MASK)];

        /* enumerate trail surrogates for this lead surrogate */
        offset=trie->getFoldingOffset(value);
        if(offset<=0) {
            /* no data for this lead surrogate */
            if(prevValue!=initialValue) {
                if(prev<c) {
                    if(!enumRange(context, prev, c, prevValue)) {
                        return;
                    }
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }

            /* nothing else to do for the supplementary code points for this lead surrogate */
            c+=0x400;
        } else {
            /* enumerate code points for this lead surrogate */
            i=offset;
            offset+=UTRIE_SURROGATE_BLOCK_COUNT;
            do {
                /* copy of most of the body of the BMP loop */
                block=idx[i]<<UTRIE_INDEX_SHIFT;
                if(block==prevBlock) {
                    /* the block is the same as the previous one, and filled with value */
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else if(block==nullBlock) {
                    /* this is the all-initial-value block */
                    if(prevValue!=initialValue) {
                        if(prev<c) {
                            if(!enumRange(context, prev, c, prevValue)) {
                                return;
                            }
                        }
                        prevBlock=nullBlock;
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE_DATA_BLOCK_LENGTH;
                } else {
                    prevBlock=block;
                    for(j=0; j<UTRIE_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c) {
                                if(!enumRange(context, prev, c, prevValue)) {
                                    return;
                                }
                            }
                            if(j>0) {
                                /* the block is not filled with all the same value */
                                prevBlock=-1;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            } while(++i<offset);
        }

        ++l;
    }

    /* deliver last range */
    enumRange(context, prev, c, prevValue);
}